

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analysis.cc
# Opt level: O1

void __thiscall gimage::Histogram::setSize(Histogram *this,int width,int height,int binsize)

{
  void *pvVar1;
  undefined8 *puVar2;
  ulong uVar3;
  
  if ((*(int *)this != width) || (*(int *)(this + 4) != height)) {
    if (*(void **)(this + 0x10) != (void *)0x0) {
      operator_delete__(*(void **)(this + 0x10));
    }
    if (*(void **)(this + 0x18) != (void *)0x0) {
      operator_delete__(*(void **)(this + 0x18));
    }
    *(int *)this = width;
    *(int *)(this + 4) = height;
    *(undefined8 *)(this + 0x10) = 0;
    *(undefined8 *)(this + 0x18) = 0;
    if (0 < height && 0 < width) {
      pvVar1 = operator_new__((ulong)(uint)(height * width) << 3);
      *(void **)(this + 0x10) = pvVar1;
      puVar2 = (undefined8 *)operator_new__((ulong)(uint)height * 8);
      *(undefined8 **)(this + 0x18) = puVar2;
      *puVar2 = pvVar1;
      if (1 < height) {
        uVar3 = 1;
        do {
          *(ulong *)(*(long *)(this + 0x18) + uVar3 * 8) =
               *(long *)(*(long *)(this + 0x18) + -8 + uVar3 * 8) + (ulong)(uint)width * 8;
          uVar3 = uVar3 + 1;
        } while ((uint)height != uVar3);
      }
    }
  }
  *(int *)(this + 8) = binsize;
  return;
}

Assistant:

void Histogram::setSize(int width, int height, int binsize)
{
  if (w != width || h != height)
  {
    delete [] val;
    delete [] row;

    w=width;
    h=height;
    val=0;
    row=0;

    if (w > 0 && h > 0)
    {
      val=new unsigned long [w*h];
      row=new unsigned long * [h];

      row[0]=val;

      for (int k=1; k<h; k++)
      {
        row[k]=row[k-1]+w;
      }
    }
  }

  bs=binsize;
}